

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkFromNdr(void *pData)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Wlc_Ntk_t *p;
  Vec_Int_t *pVVar8;
  Vec_Wrd_t *pVVar9;
  word *pwVar10;
  Wlc_Obj_t *pWVar11;
  Wlc_Obj_t *pWVar12;
  int *piVar13;
  long lVar14;
  word *pwVar15;
  char *pcVar16;
  Abc_Nam_t *pAVar17;
  Wlc_Ntk_t *p_00;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar18;
  undefined8 extraout_RDX_00;
  word *extraout_RDX_01;
  word *extraout_RDX_02;
  int Count;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int Obj;
  int iVar22;
  int i;
  int fFound;
  int local_8c;
  Vec_Wrd_t *local_88;
  Vec_Int_t *local_80;
  int *pArray;
  uint local_70;
  int local_6c;
  ulong local_68;
  int Beg_1;
  int End;
  int local_54;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pVVar7 = Vec_IntAlloc(100);
  iVar19 = 0;
  for (iVar22 = 3; iVar22 < *(int *)(*(long *)((long)pData + 0x10) + 8) + 2; iVar22 = iVar22 + iVar2
      ) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)pData,iVar22);
    iVar19 = iVar19 + (uint)(iVar2 == 3);
    iVar2 = Ndr_DataSize((Ndr_Data_t *)pData,iVar22);
  }
  p = Wlc_NtkAlloc("top",iVar19 + 1);
  Wlc_NtkCheckIntegrity(pData);
  (p->vFfs).nSize = 0;
  local_80 = &p->vNameIds;
  Vec_IntFill(local_80,p->nObjsAlloc,0);
  for (iVar22 = 3; iVar19 = *(int *)(*(long *)((long)pData + 0x10) + 8), iVar22 < iVar19 + 2;
      iVar22 = iVar22 + iVar19) {
    iVar19 = Ndr_DataType((Ndr_Data_t *)pData,iVar22);
    if ((iVar19 == 3) && (iVar19 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar22,3), iVar19 != 0)) {
      iVar19 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar22,&End,(int *)&pArray);
      iVar19 = Wlc_ObjAlloc(p,1,iVar19,End,(int)pArray);
      iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar22,5);
      Vec_IntWriteEntry(local_80,iVar19,iVar2);
    }
    iVar19 = Ndr_DataSize((Ndr_Data_t *)pData,iVar22);
  }
  local_40 = &p->vFfs;
  local_38 = &p->vFfs2;
  local_88 = (Vec_Wrd_t *)0x0;
  iVar22 = 3;
  do {
    if (iVar19 + 2 <= iVar22) {
      iVar2 = 1;
      for (iVar22 = 3; iVar22 < iVar19 + 2; iVar22 = iVar22 + iVar4) {
        iVar19 = Ndr_DataType((Ndr_Data_t *)pData,iVar22);
        if ((iVar19 == 3) && (iVar19 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar22,4), iVar19 != 0)) {
          iVar19 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar22,&End,&fFound);
          iVar4 = Ndr_ObjReadArray((Ndr_Data_t *)pData,iVar22,4,&pArray);
          local_68 = CONCAT44(local_68._4_4_,iVar4);
          iVar19 = Wlc_ObjAlloc(p,7,iVar19,End,fFound);
          iVar4 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar22,5);
          if (((int)local_68 != 1) || (iVar4 != -1)) {
            __assert_fail("nArray == 1 && NameId == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                          ,0x1bf,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
          }
          pWVar11 = Wlc_NtkObj(p,iVar19);
          Vec_IntFill(pVVar7,1,*(int *)CONCAT44(pArray._4_4_,(int)pArray));
          Wlc_ObjAddFanins(p,pWVar11,pVVar7);
          Wlc_ObjSetCo(p,pWVar11,0);
        }
        iVar4 = Ndr_DataSize((Ndr_Data_t *)pData,iVar22);
        iVar19 = *(int *)(*(long *)((long)pData + 0x10) + 8);
      }
      Vec_IntFree(pVVar7);
      iVar22 = 0;
      pVVar7 = Vec_IntAlloc(0);
      if ((p->vNameIds).nSize != 0) {
        iVar19 = Vec_IntFindMax(local_80);
        Vec_IntFill(pVVar7,iVar19 + 1,0);
        for (; iVar22 < (p->vNameIds).nSize; iVar22 = iVar22 + 1) {
          iVar19 = Vec_IntEntry(local_80,iVar22);
          if (iVar19 != 0) {
            Vec_IntWriteEntry(pVVar7,iVar19,iVar22);
          }
        }
      }
      for (; pVVar1 = local_40, iVar2 < p->iObj; iVar2 = iVar2 + 1) {
        pWVar11 = Wlc_NtkObj(p,iVar2);
        piVar13 = Wlc_ObjFanins(pWVar11);
        for (lVar14 = 0; lVar14 < (int)pWVar11->nFanins; lVar14 = lVar14 + 1) {
          iVar22 = Vec_IntEntry(pVVar7,piVar13[lVar14]);
          piVar13[lVar14] = iVar22;
        }
      }
      if (p->vInits != (Vec_Int_t *)0x0) {
        for (iVar22 = 0; iVar22 < (p->vFfs).nSize; iVar22 = iVar22 + 1) {
          iVar19 = Vec_IntEntry(pVVar1,iVar22);
          iVar19 = Vec_IntEntry(pVVar7,iVar19);
          Vec_IntWriteEntry(pVVar1,iVar22,iVar19);
        }
        iVar22 = 0;
        while( true ) {
          iVar19 = p->vInits->nSize;
          if (iVar19 <= iVar22) break;
          iVar19 = Vec_IntEntry(p->vInits,iVar22);
          if (0 < iVar19) {
            pVVar8 = p->vInits;
            iVar19 = Vec_IntEntry(pVVar7,iVar19);
            Vec_IntWriteEntry(pVVar8,iVar22,iVar19);
          }
          iVar22 = iVar22 + 1;
        }
        uVar3 = (p->vFfs).nSize;
        if ((uVar3 & 1) != 0) {
          __assert_fail("(Vec_IntSize(&pNtk->vFfs) & 1) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x1d6,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        if (uVar3 != iVar19 * 2) {
          __assert_fail("Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x1d7,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        for (uVar20 = 0; (int)uVar20 < (int)uVar3; uVar20 = uVar20 + 1) {
          iVar22 = Vec_IntEntry(pVVar1,uVar20);
          pWVar11 = Wlc_NtkObj(p,iVar22);
          if ((uVar20 & 1) != 0) {
            Wlc_ObjSetCo(p,pWVar11,1);
          }
          uVar3 = (p->vFfs).nSize;
        }
        (p->vFfs).nSize = 0;
        pcVar16 = Wlc_PrsConvertInitValues(p);
        p->pInits = pcVar16;
      }
      Vec_IntFree(pVVar7);
      uVar20 = Vec_IntFindMax(local_80);
      uVar3 = uVar20 + 1;
      uVar21 = (ulong)uVar3;
      if (1 < uVar3) {
        uVar21 = 0;
        for (uVar6 = uVar20; uVar6 != 0; uVar6 = uVar6 / 10) {
          uVar21 = (ulong)((int)uVar21 + 1);
        }
      }
      pAVar17 = Abc_NamStart(uVar3,10);
      p->pManName = pAVar17;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      for (uVar3 = 1; uVar3 - uVar20 != 1; uVar3 = uVar3 + 1) {
        sprintf((char *)&End,"s%0*d",uVar21,(ulong)uVar3);
        uVar6 = Abc_NamStrFindOrAdd(p->pManName,(char *)&End,&fFound);
        if ((fFound != 0) || (uVar3 != uVar6)) {
          __assert_fail("!fFound && i == NameId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x1ec,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
      }
      iVar22 = 1;
      p_00 = Wlc_NtkDupDfs(p,0,1);
      Wlc_NtkFree(p);
      if (local_88 != (Vec_Wrd_t *)0x0) {
        pVVar9 = Vec_WrdStart(p_00->iObj);
        p_00->vLutTruths = pVVar9;
        for (; iVar22 < p_00->iObj; iVar22 = iVar22 + 1) {
          pWVar11 = Wlc_NtkObj(p_00,iVar22);
          iVar19 = (int)(((long)pWVar11 - (long)p_00->pObjs) / 0x18);
          uVar3 = Vec_IntEntry(&p_00->vNameIds,iVar19);
          if (((undefined1  [24])((undefined1  [24])*pWVar11 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x3b) && (uVar3 != 0)) {
            if (((int)uVar3 < 0) || (local_88->nSize <= (int)uVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            Vec_WrdWriteEntry(p_00->vLutTruths,iVar19,local_88->pArray[uVar3]);
          }
        }
        if (local_88->pArray != (word *)0x0) {
          free(local_88->pArray);
          local_88->pArray = (word *)0x0;
        }
        free(local_88);
      }
      p_00->fMemPorts = 1;
      p_00->fEasyFfs = 1;
      return p_00;
    }
    iVar19 = Ndr_DataType((Ndr_Data_t *)pData,iVar22);
    if (((iVar19 == 3) && (iVar19 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar22,3), iVar19 == 0)) &&
       (iVar19 = Ndr_ObjIsType((Ndr_Data_t *)pData,iVar22,4), iVar19 == 0)) {
      iVar2 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar22,&fFound,&Beg_1);
      uVar3 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar22,6);
      iVar19 = Ndr_ObjReadArray((Ndr_Data_t *)pData,iVar22,4,&pArray);
      local_68 = (ulong)uVar3;
      End = iVar19;
      local_54 = iVar19;
      iVar4 = Ndr_TypeNdr2Wlc(uVar3);
      local_70 = fFound;
      local_6c = Beg_1;
      iVar2 = Wlc_ObjAlloc(p,iVar4,iVar2,fFound,Beg_1);
      iVar4 = Ndr_ObjReadBody((Ndr_Data_t *)pData,iVar22,5);
      pVVar7->nSize = 0;
      i = 0;
      uVar18 = extraout_RDX;
      local_8c = iVar4;
      if (iVar19 < 1) {
        iVar19 = i;
      }
      for (; pVVar1 = local_40, iVar5 = (int)uVar18, iVar19 != i; i = i + 1) {
        iVar5 = Vec_IntEntry((Vec_Int_t *)&End,i);
        Vec_IntPush(pVVar7,iVar5);
        uVar18 = extraout_RDX_00;
      }
      iVar19 = (int)local_68;
      switch(iVar19) {
      case 0x58:
        pVVar8 = p->vInits;
        if (pVVar8 == (Vec_Int_t *)0x0) {
          pVVar8 = Vec_IntAlloc(100);
          p->vInits = pVVar8;
        }
        if (pVVar7->nSize == 2) {
          pVVar7->nSize = 1;
          iVar19 = pVVar7->pArray[1];
        }
        else {
          iVar19 = local_6c + ~local_70;
        }
        Vec_IntPush(pVVar8,iVar19);
        pWVar11 = Wlc_NtkObj(p,iVar2);
        iVar19 = local_8c;
        if ((undefined1  [24])((undefined1  [24])*pWVar11 & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) {
          __assert_fail("Wlc_ObjType(pObj) == WLC_OBJ_FO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x196,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        Vec_IntWriteEntry(local_80,iVar2,local_8c);
        Vec_IntPush(pVVar1,iVar19);
        if (pVVar7->nSize != 1) {
          __assert_fail("Vec_IntSize(vFanins) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x19a,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        iVar19 = Vec_IntEntry(pVVar7,0);
        Vec_IntPush(pVVar1,iVar19);
        goto LAB_00308da5;
      case 0x59:
        Vec_IntPush(local_38,iVar2);
        break;
      case 0x5a:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
switchD_00308b2e_caseD_5a:
        break;
      case 0x5b:
        Vec_IntPush(pVVar7,local_70);
        Vec_IntPush(pVVar7,local_6c);
        break;
      case 0x61:
        piVar13 = Ndr_ObjReadBodyP((Ndr_Data_t *)pData,iVar22,iVar5);
        Ndr_ObjReadConstant(pVVar7,(char *)piVar13);
        break;
      default:
        if (iVar19 == 0x15) {
          if (pVVar7->nSize == 3) {
            piVar13 = Vec_IntEntryP(pVVar7,1);
            iVar19 = *piVar13;
            piVar13 = Vec_IntEntryP(pVVar7,2);
            iVar4 = *piVar13;
            piVar13 = Vec_IntEntryP(pVVar7,1);
            *piVar13 = iVar4;
            piVar13 = Vec_IntEntryP(pVVar7,2);
            *piVar13 = iVar19;
            goto switchD_00308b2e_caseD_5a;
          }
        }
        else if (iVar19 == 0x4b) {
          pVVar9 = local_88;
          if (local_88 == (Vec_Wrd_t *)0x0) {
            pVVar9 = Vec_WrdStart(1000);
            iVar5 = extraout_EDX;
          }
          iVar19 = pVVar9->nSize;
          local_88 = pVVar9;
          if ((iVar4 < iVar19) || (uVar3 = iVar4 * 2, (int)uVar3 <= iVar19)) {
            pwVar15 = (word *)Ndr_ObjReadBodyP((Ndr_Data_t *)pData,iVar22,iVar5);
            Vec_WrdWriteEntry(pVVar9,local_8c,*pwVar15);
            goto switchD_00308b2e_caseD_5a;
          }
          iVar4 = pVVar9->nCap;
          uVar20 = iVar4 * 2;
          pwVar15 = (word *)(ulong)uVar20;
          uVar6 = uVar3;
          if ((((int)uVar20 < (int)uVar3) || (uVar6 = uVar20, iVar4 < (int)uVar3)) &&
             (iVar4 < (int)uVar6)) {
            if (pVVar9->pArray == (word *)0x0) {
              pwVar10 = (word *)malloc((long)(int)uVar6 << 3);
              pwVar15 = extraout_RDX_02;
            }
            else {
              pwVar10 = (word *)realloc(pVVar9->pArray,(long)(int)uVar6 << 3);
              pwVar15 = extraout_RDX_01;
            }
            pVVar9->pArray = pwVar10;
            if (pwVar10 == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar9->nCap = uVar6;
            iVar19 = pVVar9->nSize;
          }
          for (lVar14 = (long)iVar19; lVar14 < (int)uVar3; lVar14 = lVar14 + 1) {
            pwVar15 = pVVar9->pArray;
            pwVar15[lVar14] = 0;
          }
          pVVar9->nSize = uVar3;
          pwVar15 = (word *)Ndr_ObjReadBodyP((Ndr_Data_t *)pData,iVar22,(int)pwVar15);
          Vec_WrdWriteEntry(pVVar9,local_8c,*pwVar15);
        }
      }
      pWVar11 = Wlc_NtkObj(p,iVar2);
      Wlc_ObjAddFanins(p,pWVar11,pVVar7);
      Vec_IntWriteEntry(local_80,iVar2,local_8c);
      if ((int)local_68 == 0x35) {
        pWVar11 = Wlc_NtkObj(p,iVar2);
        if (pWVar11->nFanins != 2) {
          __assert_fail("Wlc_ObjFaninNum(pObj) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                        ,0x1b3,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        pWVar12 = Wlc_ObjFanin0(p,pWVar11);
        *(byte *)pWVar12 = *(byte *)pWVar12 | 0x40;
        piVar13 = Wlc_ObjFanins(pWVar11);
        pWVar11 = Wlc_NtkObj(p,piVar13[1]);
        *(byte *)pWVar11 = *(byte *)pWVar11 | 0x40;
      }
    }
LAB_00308da5:
    iVar19 = Ndr_DataSize((Ndr_Data_t *)pData,iVar22);
    iVar22 = iVar22 + iVar19;
    iVar19 = *(int *)(*(long *)((long)pData + 0x10) + 8);
  } while( true );
}

Assistant:

Wlc_Ntk_t * Wlc_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Wlc_Obj_t * pObj; Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    int Mod = 2, i, k, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Vec_Wrd_t * vTruths = NULL;
    Wlc_Ntk_t * pTemp, * pNtk = Wlc_NtkAlloc( "top", Ndr_DataObjNum(p, Mod)+1 );
    Wlc_NtkCheckIntegrity( pData );
    Vec_IntClear( &pNtk->vFfs );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wlc_NtkCleanNameId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wlc_ObjAlloc( pNtk, Ndr_TypeNdr2Wlc(Type), Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        if ( Type == ABC_OPER_DFF )
        {
            // save init state
            if ( pNtk->vInits == NULL )
                pNtk->vInits = Vec_IntAlloc( 100 );
            if ( Vec_IntSize(vFanins) == 2 )
                Vec_IntPush( pNtk->vInits, Vec_IntPop(vFanins) );
            else // assume const0 if init is not given
                Vec_IntPush( pNtk->vInits, -(End-Beg+1) );
            // save flop output
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjType(pObj) == WLC_OBJ_FO );
            Wlc_ObjSetNameId( pNtk, iObj, NameId );
            Vec_IntPush( &pNtk->vFfs, NameId );
            // save flop input
            assert( Vec_IntSize(vFanins) == 1 );
            Vec_IntPush( &pNtk->vFfs, Vec_IntEntry(vFanins, 0) );
            continue;
        }
        if ( Type == ABC_OPER_DFFRSE )
            Vec_IntPush( &pNtk->vFfs2, iObj );
        if ( Type == ABC_OPER_LUT )
        {
            if ( vTruths == NULL )
                vTruths = Vec_WrdStart( 1000 );
            if ( NameId >= Vec_WrdSize(vTruths) )
                Vec_WrdFillExtra( vTruths, 2*NameId, 0 );
            Vec_WrdWriteEntry( vTruths, NameId, *((word *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION)) );
        }
        if ( Type == ABC_OPER_SLICE )
            Vec_IntPushTwo( vFanins, End, Beg );
        else if ( Type == ABC_OPER_CONST )
            Ndr_ObjReadConstant( vFanins, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
            ABC_SWAP( int, Vec_IntEntryP(vFanins, 1)[0], Vec_IntEntryP(vFanins, 2)[0] );
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjFaninNum(pObj) == 2 );
            Wlc_ObjFanin0(pNtk, pObj)->Signed = 1;
            Wlc_ObjFanin1(pNtk, pObj)->Signed = 1;
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wlc_ObjAlloc( pNtk, WLC_OBJ_BUF, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        assert( nArray == 1 && NameId == -1 );
        pObj = Wlc_NtkObj( pNtk, iObj );
        Vec_IntFill( vFanins, 1, pArray[0] );
        Wlc_ObjAddFanins( pNtk, pObj, vFanins );
        Wlc_ObjSetCo( pNtk, pObj, 0 );
    }
    Vec_IntFree( vFanins );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            pFanins[k] = Vec_IntEntry(vName2Obj, pFanins[k]);
    }
    if ( pNtk->vInits )
    {
        Vec_IntForEachEntry( &pNtk->vFfs, NameId, i )
            Vec_IntWriteEntry( &pNtk->vFfs, i, Vec_IntEntry(vName2Obj, NameId) );
        Vec_IntForEachEntry( pNtk->vInits, NameId, i )
            if ( NameId > 0 )
                Vec_IntWriteEntry( pNtk->vInits, i, Vec_IntEntry(vName2Obj, NameId) );
        // move FO/FI to be part of CI/CO
        assert( (Vec_IntSize(&pNtk->vFfs) & 1) == 0 );
        assert( Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits) );
        Wlc_NtkForEachFf( pNtk, pObj, i )
            if ( i & 1 )
                Wlc_ObjSetCo( pNtk, pObj, 1 );
            //else
            //    Wlc_ObjSetCi( pNtk, pObj );
        Vec_IntClear( &pNtk->vFfs );
        // convert init values into binary string
        //Vec_IntPrint( &p->pNtk->vInits );
        pNtk->pInits = Wlc_PrsConvertInitValues( pNtk );
        //printf( "%s", p->pNtk->pInits );
    }
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    //Ndr_NtkPrintNodes( pNtk );
    //Wlc_WriteVer( pNtk, "temp_ndr.v", 0, 0 );
    // derive topological order
    pNtk = Wlc_NtkDupDfs( pTemp = pNtk, 0, 1 );
    Wlc_NtkFree( pTemp );
    // copy truth tables
    if ( vTruths )
    {
        pNtk->vLutTruths = Vec_WrdStart( Wlc_NtkObjNumMax(pNtk) );
        Wlc_NtkForEachObj( pNtk, pObj, i )
        {
            int iObj   = Wlc_ObjId(pNtk, pObj);
            int NameId = Wlc_ObjNameId(pNtk, iObj);
            word Truth;
            if ( pObj->Type != WLC_OBJ_LUT || NameId == 0 )
                continue;
            Truth = Vec_WrdEntry(vTruths, NameId);
            assert( sizeof(void *) == 8 || Wlc_ObjFaninNum(pObj) < 6 );
            Vec_WrdWriteEntry( pNtk->vLutTruths, iObj, Truth );
        }
        Vec_WrdFreeP( &vTruths );
    }
    //Ndr_NtkPrintNodes( pNtk );
    pNtk->fMemPorts = 1;          // the network contains memory ports
    pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}